

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ska2anm.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  int iVar4;
  char *pcVar5;
  undefined4 extraout_var;
  Animation *this;
  undefined4 extraout_var_00;
  long lVar6;
  char **ppcVar7;
  char *pcVar8;
  char cVar9;
  StreamFile local_40;
  
  ppcVar7 = argv;
  rw::Engine::init((Engine *)0x0,(EVP_PKEY_CTX *)argv);
  iVar4 = (int)ppcVar7;
  rw::registerHAnimPlugin();
  pcVar8 = (char *)0x0;
  rw::Engine::open((char *)0x0,iVar4);
  rw::Engine::start();
  if (argv0 == (char *)0x0) {
    argv0 = *argv;
  }
  ppcVar7 = argv + 1;
  iVar4 = argc + -1;
  pcVar5 = argv[1];
  if (pcVar5 != (char *)0x0) {
    while (*pcVar5 == '-') {
      pcVar8 = pcVar5 + 1;
      cVar9 = pcVar5[1];
      if (cVar9 == '-') {
        if (pcVar5[2] == '\0') {
          iVar4 = argc + -2;
          ppcVar7 = argv + 2;
          break;
        }
      }
      else if (cVar9 == '\0') break;
      while (argc = iVar4, argv = ppcVar7, cVar9 == 'v') {
        if (pcVar8[1] == '\0') {
          pcVar8 = argv[1];
          if (pcVar8 == (char *)0x0) goto LAB_001060e3;
          argv = argv + 1;
          argc = argc + -1;
        }
        else {
          pcVar8 = pcVar8 + 1;
        }
        __isoc99_sscanf(pcVar8,"%x",&rw::version);
        pcVar8 = "";
        ppcVar7 = argv;
        iVar4 = argc;
        cVar9 = '\0';
      }
      if (cVar9 != '\0') goto LAB_001060e3;
      ppcVar7 = argv + 1;
      iVar4 = argc + -1;
      pcVar5 = argv[1];
      if (pcVar5 == (char *)0x0) break;
    }
  }
  if (0 < iVar4) {
    local_40.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00148c08;
    local_40.file = (void *)0x0;
    iVar2 = rw::StreamFile::open(&local_40,*ppcVar7,0x13303f);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      main_cold_2();
    }
    else {
      uVar3 = rw::Stream::readU32(&local_40.super_Stream);
      iVar2 = 0;
      rw::StreamFile::seek(&local_40,0,0);
      if (uVar3 == 0x1b) {
        this = (Animation *)0x0;
        iVar2 = 0x1b;
        bVar1 = rw::findChunk(&local_40.super_Stream,0x1b,(uint32 *)0x0,(uint32 *)0x0);
        if (bVar1) {
          this = rw::Animation::streamRead(&local_40.super_Stream);
        }
      }
      else {
        this = rw::Animation::streamReadLegacy(&local_40.super_Stream);
      }
      rw::StreamFile::close(&local_40,iVar2);
      if (this == (Animation *)0x0) {
        main_cold_1();
      }
      else {
        if (iVar4 == 1) {
          pcVar8 = "out.anm";
          if (uVar3 == 0x1b) {
            pcVar8 = "out.ska";
          }
        }
        else {
          pcVar8 = ppcVar7[1];
        }
        iVar4 = rw::StreamFile::open(&local_40,pcVar8,0x13308b);
        if (CONCAT44(extraout_var_00,iVar4) != 0) {
          if (uVar3 == 0x1b) {
            rw::Animation::streamWriteLegacy(this,&local_40.super_Stream);
          }
          else {
            rw::Animation::streamWrite(this,&local_40.super_Stream);
          }
          rw::Animation::destroy(this);
          return 0;
        }
        fprintf(_stderr,"Error: couldn\'t open %s\n",pcVar8);
      }
    }
    return 1;
  }
LAB_001060e3:
  usage();
  lVar6 = 0;
  do {
    if (*(long *)((long)&rw::interpInfoList + lVar6) == 0) {
      *(char **)((long)&rw::interpInfoList + lVar6) = pcVar8;
      return (int)lVar6;
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x50);
  return 0x50;
}

Assistant:

int
main(int argc, char *argv[])
{
	rw::Engine::init();
	rw::registerHAnimPlugin();
	rw::Engine::open(nil);
	rw::Engine::start();

	ARGBEGIN{
	case 'v':
		sscanf(EARGF(usage()), "%x", &rw::version);
		break;
	default:
		usage();
	}